

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O3

void Bac_PtrDumpBoxVerilog(FILE *pFile,Vec_Ptr_t *vBox)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  
  if (0 < vBox->nSize) {
    fprintf((FILE *)pFile,"  %s",*vBox->pArray);
    if (1 < vBox->nSize) {
      fprintf((FILE *)pFile," %s (",vBox->pArray[1]);
      iVar2 = vBox->nSize;
      if (2 < iVar2) {
        uVar3 = 2;
        do {
          if ((long)iVar2 <= (long)(uVar3 + 1)) goto LAB_003ba866;
          pcVar1 = "T = %d\t\t";
          if (uVar3 < iVar2 - 2) {
            pcVar1 = "    \"%s\", ";
          }
          fprintf((FILE *)pFile,".%s(%s)%s",vBox->pArray[uVar3],vBox->pArray[uVar3 + 1],pcVar1 + 8);
          uVar3 = uVar3 + 2;
          iVar2 = vBox->nSize;
        } while ((int)uVar3 < iVar2);
      }
      fwrite(");\n",3,1,(FILE *)pFile);
      return;
    }
  }
LAB_003ba866:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Bac_PtrDumpBoxVerilog( FILE * pFile, Vec_Ptr_t * vBox )
{
    char * pName; int i;
    fprintf( pFile, "  %s", (char *)Vec_PtrEntry(vBox, 0) );
    fprintf( pFile, " %s (", (char *)Vec_PtrEntry(vBox, 1) ); // write intance name in Verilog
    Vec_PtrForEachEntryStart( char *, vBox, pName, i, 2 )
        fprintf( pFile, ".%s(%s)%s", pName, (char *)Vec_PtrEntry(vBox, i+1), i < Vec_PtrSize(vBox) - 2 ? ", ":"" ), i++;
    fprintf( pFile, ");\n" );
}